

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O0

Result __thiscall
wabt::WastParser::ErrorExpected
          (WastParser *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *expected,char *example)

{
  Location loc;
  ulong uVar1;
  ulong uVar2;
  bool bVar3;
  size_type sVar4;
  const_reference pvVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 in_R9;
  string local_110;
  undefined8 local_f0;
  size_t local_e8;
  char *local_e0;
  anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2 local_d8;
  ulong local_d0;
  size_t i;
  string expected_str;
  Token token;
  char *example_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *expected_local;
  WastParser *this_local;
  
  GetToken((Token *)&token.field_2.literal_.text._M_str,this);
  Consume((Token *)((long)&expected_str.field_2 + 8),this);
  std::__cxx11::string::string((string *)&i);
  bVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(expected);
  if (!bVar3) {
    std::__cxx11::string::operator=((string *)&i,", expected ");
    for (local_d0 = 0; uVar1 = local_d0,
        sVar4 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size(expected), uVar2 = local_d0, uVar1 < sVar4; local_d0 = local_d0 + 1) {
      if (local_d0 != 0) {
        sVar4 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size(expected);
        if (uVar2 == sVar4 - 1) {
          std::__cxx11::string::operator+=((string *)&i," or ");
        }
        else {
          std::__cxx11::string::operator+=((string *)&i,", ");
        }
      }
      pvVar5 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](expected,local_d0);
      std::__cxx11::string::operator+=((string *)&i,(string *)pvVar5);
    }
    if (example != (char *)0x0) {
      std::__cxx11::string::operator+=((string *)&i," (e.g. ");
      std::__cxx11::string::operator+=((string *)&i,example);
      std::__cxx11::string::operator+=((string *)&i,")");
    }
  }
  local_f0 = expected_str.field_2._8_8_;
  local_e8 = token.loc.filename._M_len;
  local_e0 = token.loc.filename._M_str;
  local_d8.offset = (size_t)token.loc.field_1.field_1.offset;
  Token::to_string_clamp_abi_cxx11_(&local_110,(Token *)((long)&expected_str.field_2 + 8),0x50);
  uVar6 = std::__cxx11::string::c_str();
  uVar7 = std::__cxx11::string::c_str();
  loc.filename._M_str = (char *)local_e8;
  loc.filename._M_len = local_f0;
  loc.field_1.field_1.offset =
       (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
       (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)local_e0;
  loc.field_1._8_8_ = local_d8.offset;
  Error(this,loc,"unexpected token \"%s\"%s.",uVar6,uVar7,local_e0,in_R9);
  std::__cxx11::string::~string((string *)&local_110);
  Result::Result((Result *)((long)&this_local + 4),Error);
  std::__cxx11::string::~string((string *)&i);
  return (Result)this_local._4_4_;
}

Assistant:

Result WastParser::ErrorExpected(const std::vector<std::string>& expected,
                                 const char* example) {
  GetToken();
  Token token = Consume();
  std::string expected_str;
  if (!expected.empty()) {
    expected_str = ", expected ";
    for (size_t i = 0; i < expected.size(); ++i) {
      if (i != 0) {
        if (i == expected.size() - 1) {
          expected_str += " or ";
        } else {
          expected_str += ", ";
        }
      }

      expected_str += expected[i];
    }

    if (example) {
      expected_str += " (e.g. ";
      expected_str += example;
      expected_str += ")";
    }
  }

  Error(token.loc, "unexpected token \"%s\"%s.",
        token.to_string_clamp(kMaxErrorTokenLength).c_str(),
        expected_str.c_str());
  return Result::Error;
}